

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int set_non_blocking_mode(SOCKET sock)

{
  uint uVar1;
  int iVar2;
  undefined4 in_register_0000003c;
  
  uVar1 = fcntl64(CONCAT44(in_register_0000003c,sock),3,0);
  if ((int)uVar1 < 0) {
    iVar2 = -1;
  }
  else {
    iVar2 = fcntl64(sock,4,uVar1 | 0x800);
    iVar2 = iVar2 >> 0x1f;
  }
  return iVar2;
}

Assistant:

static int
set_non_blocking_mode(SOCKET sock)
{
	int flags = fcntl(sock, F_GETFL, 0);
	if (flags < 0) {
		return -1;
	}

	if (fcntl(sock, F_SETFL, (flags | O_NONBLOCK)) < 0) {
		return -1;
	}
	return 0;
}